

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

void __thiscall
QNetworkHeadersPrivate::parseAndSetHeader
          (QNetworkHeadersPrivate *this,KnownHeaders key,QByteArrayView value)

{
  bool bVar1;
  long in_FS_OFFSET;
  KnownHeaders local_4c;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = key;
  if (value.m_data == (storage_type *)0x0) {
    QHash<QNetworkRequest::KnownHeaders,_QVariant>::removeImpl<QNetworkRequest::KnownHeaders>
              (&this->cookedHeaders,&local_4c);
  }
  else {
    if (key == ContentLengthHeader) {
      local_48._0_4_ = 1;
      bVar1 = QHash<QNetworkRequest::KnownHeaders,_QVariant>::contains
                        (&this->cookedHeaders,(KnownHeaders *)local_48.data);
      if (bVar1) goto LAB_00193950;
    }
    parseHeaderValue((QVariant *)&local_48,local_4c,value);
    QHash<QNetworkRequest::KnownHeaders,QVariant>::emplace<QVariant_const&>
              ((QHash<QNetworkRequest::KnownHeaders,QVariant> *)&this->cookedHeaders,&local_4c,
               (QVariant *)&local_48);
    QVariant::~QVariant((QVariant *)&local_48);
  }
LAB_00193950:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkHeadersPrivate::parseAndSetHeader(QNetworkRequest::KnownHeaders key,
                                               QByteArrayView value)
{
    if (value.isNull()) {
        cookedHeaders.remove(key);
    } else if (key == QNetworkRequest::ContentLengthHeader
               && cookedHeaders.contains(QNetworkRequest::ContentLengthHeader)) {
        // Only set the cooked header "Content-Length" once.
        // See bug QTBUG-15311
    } else {
        cookedHeaders.insert(key, parseHeaderValue(key, value));
    }
}